

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O1

bool __thiscall SharedDirectory::can_read_file(SharedDirectory *this,string *name)

{
  pointer pcVar1;
  iterator iVar2;
  bool bVar3;
  undefined1 local_68 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  path local_40;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_68._8_8_ = &local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_68 + 8),pcVar1,pcVar1 + name->_M_string_length);
  path_in_dir(&local_40,this,(string *)(local_68 + 8));
  boost::filesystem::detail::status((path *)local_68,(error_code *)&local_40);
  if ((uint)local_68._0_4_ < 2) {
    bVar3 = false;
  }
  else {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)this,name);
    bVar3 = (_Rb_tree_header *)iVar2._M_node !=
            &(this->indexed_files)._M_t._M_impl.super__Rb_tree_header;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.m_pathname._M_dataplus._M_p != &local_40.m_pathname.field_2) {
    operator_delete(local_40.m_pathname._M_dataplus._M_p,
                    local_40.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._8_8_ != &local_50) {
    operator_delete((void *)local_68._8_8_,local_50._0_8_ + 1);
  }
  return bVar3;
}

Assistant:

bool SharedDirectory::can_read_file(const std::string &name) {
  return exists(path_in_dir(name)) && indexed_files.find(name) != indexed_files.end();
}